

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disasmtool.c
# Opt level: O3

_Bool parse_arguments(int argc,char **argv,DISASM_OPTIONS *Options)

{
  char cVar1;
  char *Arg;
  _Bool _Var2;
  _Bool _Var3;
  int iVar4;
  ulonglong uVar5;
  byte bVar6;
  byte bVar7;
  char *__format;
  int iVar8;
  long in_FS_OFFSET;
  bool bVar9;
  uint local_3c;
  long lStack_38;
  DWORD gprIdx;
  
  lStack_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (argc < 2 || argv == (char **)0x0) {
    print_help();
  }
  else {
    memset(Options,0,0x148);
    Options->Command = commandDecode;
    Options->Ring = '\x03';
    Options->Print = true;
    Options->Mode = '\x02';
    Options->Feature = 0xff;
    iVar8 = 1;
    do {
      Arg = argv[iVar8];
      _Var2 = match_gpr(Arg,&local_3c);
      if (_Var2) {
        if (iVar8 + 1 < argc) {
          uVar5 = strtoull(argv[iVar8 + 1],(char **)0x0,0);
          Options->ShemuRegs[local_3c] = uVar5;
          Options->UseShemuRegs = true;
          goto LAB_0015a6b2;
        }
        __format = "No value given for %s!\n";
LAB_0015a735:
        printf(__format,Arg);
      }
      else {
        iVar4 = strcmp(Arg,"shemu");
        if (iVar4 == 0) {
          Options->Command = commandShemu;
        }
        else {
          iVar4 = strcmp(Arg,"decode");
          if (iVar4 == 0) {
            Options->Command = commandDecode;
          }
          else if (*Arg == '-') {
            cVar1 = Arg[1];
            switch(cVar1) {
            case 'b':
              if ((Arg[2] != 'w') || (Arg[3] != '\0')) goto switchD_0015a706_caseD_63;
              Options->BypassSelfWrites = true;
              break;
            case 'c':
            case 'd':
            case 'e':
            case 'g':
            case 'i':
            case 'j':
              goto switchD_0015a706_caseD_63;
            case 'f':
              if (Arg[2] != '\0') goto switchD_0015a706_caseD_63;
              if (iVar8 + 1 < argc) {
                Options->InputMode = inputFile;
LAB_0015a806:
                iVar8 = iVar8 + 1;
                Options->FileName = argv[iVar8];
              }
              break;
            case 'h':
              if (Arg[2] != '\0') goto switchD_0015a706_caseD_63;
              if (iVar8 + 1 < argc) {
                Options->InputMode = inputHex;
                goto LAB_0015a806;
              }
              break;
            case 'k':
              if (Arg[2] != '\0') goto switchD_0015a706_caseD_63;
              Options->Ring = '\0';
              break;
            default:
              if (cVar1 == 'o') {
                if (Arg[2] != '\0') goto switchD_0015a706_caseD_63;
                if (iVar8 + 1 < argc) {
                  uVar5 = strtoull(argv[iVar8 + 1],(char **)0x0,0);
                  Options->Offset = uVar5;
                  goto LAB_0015a6b2;
                }
              }
              else {
                if ((cVar1 != 'r') || (Arg[2] != '\0')) goto switchD_0015a706_caseD_63;
                if (iVar8 + 1 < argc) {
                  uVar5 = strtoull(argv[iVar8 + 1],(char **)0x0,0);
                  Options->Rip = uVar5;
LAB_0015a6b2:
                  iVar8 = iVar8 + 1;
                }
              }
            }
          }
          else {
switchD_0015a706_caseD_63:
            iVar4 = strcmp(Arg,"-b16");
            if (iVar4 == 0) {
              Options->Mode = '\0';
            }
            else {
              iVar4 = strcmp(Arg,"-b32");
              if (iVar4 == 0) {
                Options->Mode = '\x01';
              }
              else {
                iVar4 = strcmp(Arg,"-b64");
                if (iVar4 == 0) {
                  Options->Mode = '\x02';
                }
                else {
                  iVar4 = strcmp(Arg,"-v intel");
                  if (iVar4 == 0) {
                    Options->Vendor = '\x01';
                  }
                  else {
                    iVar4 = strcmp(Arg,"-v amd");
                    if (iVar4 == 0) {
                      Options->Vendor = '\x02';
                    }
                    else {
                      iVar4 = strcmp(Arg,"-v any");
                      if (iVar4 == 0) {
                        Options->Vendor = '\0';
                      }
                      else {
                        iVar4 = strcmp(Arg,"-t all");
                        if (iVar4 == 0) {
                          Options->Feature = 0xff;
                        }
                        else {
                          iVar4 = strcmp(Arg,"-t mpx");
                          if (iVar4 == 0) {
                            bVar6 = Options->Feature | 1;
                            bVar9 = Options->Feature == 0xff;
                            bVar7 = 1;
                          }
                          else {
                            iVar4 = strcmp(Arg,"-t cet");
                            if (iVar4 == 0) {
                              bVar6 = Options->Feature | 2;
                              bVar9 = Options->Feature == 0xff;
                              bVar7 = 2;
                            }
                            else {
                              iVar4 = strcmp(Arg,"-t cldm");
                              if (iVar4 == 0) {
                                bVar6 = Options->Feature | 4;
                                bVar9 = Options->Feature == 0xff;
                                bVar7 = 4;
                              }
                              else {
                                iVar4 = strcmp(Arg,"-t piti");
                                if (iVar4 != 0) {
                                  iVar4 = strcmp(Arg,"-t none");
                                  if (iVar4 == 0) {
                                    Options->Feature = '\0';
                                  }
                                  else {
                                    iVar4 = strcmp(Arg,"-nv");
                                    if (iVar4 == 0) {
                                      Options->Print = false;
                                    }
                                    else {
                                      iVar4 = strcmp(Arg,"-hl");
                                      if (iVar4 == 0) {
                                        Options->Highlight = true;
                                      }
                                      else {
                                        iVar4 = strcmp(Arg,"-iv");
                                        if (iVar4 == 0) {
                                          Options->Stats = true;
                                        }
                                        else {
                                          iVar4 = strcmp(Arg,"-exi");
                                          if (iVar4 == 0) {
                                            Options->ExtendedInfo = true;
                                          }
                                          else {
                                            iVar4 = strcmp(Arg,"-bits");
                                            if (iVar4 == 0) {
                                              Options->BitFields = true;
                                            }
                                            else {
                                              iVar4 = strcmp(Arg,"-skip16");
                                              if (iVar4 == 0) {
                                                Options->Skip16 = true;
                                              }
                                              else {
                                                iVar4 = strcmp(Arg,"-skip1");
                                                if (iVar4 == 0) {
                                                  Options->Skip1 = true;
                                                }
                                                else {
                                                  iVar4 = strcmp(Arg,"-skipdecoded");
                                                  if (iVar4 != 0) {
                                                    __format = "Unknown option: \'%s\'\n";
                                                    goto LAB_0015a735;
                                                  }
                                                  Options->SkipWriteDecoded = true;
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                  goto LAB_0015aae3;
                                }
                                bVar6 = Options->Feature | 8;
                                bVar9 = Options->Feature == 0xff;
                                bVar7 = 8;
                              }
                            }
                          }
                          if (bVar9) {
                            bVar6 = bVar7;
                          }
                          Options->Feature = bVar6;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
LAB_0015aae3:
      iVar8 = iVar8 + 1;
    } while (iVar8 < argc);
    _Var2 = parse_input(Options);
    _Var3 = true;
    if (_Var2) goto LAB_0015ab6d;
    puts("Could not find a valid input!");
  }
  _Var3 = false;
LAB_0015ab6d:
  if (*(long *)(in_FS_OFFSET + 0x28) != lStack_38) {
    __stack_chk_fail();
  }
  return _Var3;
}

Assistant:

_Success_(return)
bool
parse_arguments(
    _In_ int argc,
    _In_ char* argv[],
    _Out_ DISASM_OPTIONS *Options
    )
{
    int i;

    if (argc < 2 || NULL == argv)
    {
        print_help();
        return false;
    }

    memset(Options, 0, sizeof(*Options));

    // Initialize default options.
    Options->Command = commandDecode;
    Options->Mode = ND_CODE_64;
    Options->Ring = 3;
    Options->Print = true;
    Options->Vendor = ND_VEND_ANY;
    Options->Feature = ND_FEAT_ALL;
    Options->SkipWriteDecoded = false;

    i = 1;
    while (i < argc)
    {       
        DWORD gprIdx;

        if (match_gpr(argv[i], &gprIdx))
        {
            // Register value (used by shemu).
            if (i + 1 >= argc)
            {
                printf("No value given for %s!\n", argv[i]);
            }
            else
            {
                Options->ShemuRegs[gprIdx] = (size_t)strtoull(argv[i + 1], NULL, 0);
                Options->UseShemuRegs = true;
                i++;
            }
        }
        else if (strcmp(argv[i], "shemu") == 0)
        {
            // shemu command - will emulate.
            Options->Command = commandShemu;
        }
        else if (strcmp(argv[i], "decode") == 0)
        {
            // decode command.
            Options->Command = commandDecode;
        }
        else if (argv[i][0] == '-' && argv[i][1] == 'f' && argv[i][2] == 0)
        {
            // File input mode.
            if (i + 1 < argc)
            {
                Options->InputMode = inputFile;
                Options->FileName = argv[i + 1];
                i++;
            }
        }
        else if (argv[i][0] == '-' && argv[i][1] == 'h' && argv[i][2] == 0)
        {
            // Hex-string input mode.
            if (i + 1 < argc)
            {
                Options->InputMode = inputHex;
                Options->FileName = argv[i + 1];
                i++;
            }
        }
        else if (argv[i][0] == '-' && argv[i][1] == 'o' && argv[i][2] == 0)
        {
            // Offset inside the provided buffer.
            if (i + 1 < argc)
            {
                Options->Offset = (size_t)strtoull(argv[i + 1], NULL, 0);
                i++;
            }
        }
        else if (argv[i][0] == '-' && argv[i][1] == 'r' && argv[i][2] == 0)
        {
            // Rip. Can be any value, as it's used only for disassembly.
            if (i + 1 < argc)
            {
                Options->Rip = (size_t)strtoull(argv[i + 1], NULL, 0);
                i++;
            }
        }
        else if (argv[i][0] == '-' && argv[i][1] == 'k' && argv[i][2] == 0)
        {
            // Kernel-mode for shemu.
            Options->Ring = 0;
        }
        else if (argv[i][0] == '-' && argv[i][1] == 'b' && argv[i][2] == 'w' && argv[i][3] == 0)
        {
            // Bypass self writes in shemu.
            Options->BypassSelfWrites = true;
        }
        else if (0 == strcmp(argv[i], "-b16"))
        {
            // 16-bit mode.
            Options->Mode = ND_CODE_16;
        } 
        else if (0 == strcmp(argv[i], "-b32"))
        {
            // 32-bit mode.
            Options->Mode = ND_CODE_32;
        } 
        else if (0 == strcmp(argv[i], "-b64"))
        {
            // 64-bit mode.
            Options->Mode = ND_CODE_64;
        }
        else if (0 == strcmp(argv[i], "-v intel"))
        {
            // Prefer Intel instructions.
            Options->Vendor = ND_VEND_INTEL;
        }
        else if (0 == strcmp(argv[i], "-v amd"))
        {
            // Prefer AMD instructions.
            Options->Vendor = ND_VEND_AMD;
        }
        else if (0 == strcmp(argv[i], "-v any"))
        {
            // Try to decode everything.
            Options->Vendor = ND_VEND_ANY;
        }
        else if (0 == strcmp(argv[i], "-t all"))
        {
            // Enable all features.
            Options->Feature = ND_FEAT_ALL;
        }
        else if (0 == strcmp(argv[i], "-t mpx"))
        {
            // Enable MPX. 
            if (Options->Feature == ND_FEAT_ALL)
            {
                Options->Feature = 0;
            }

            Options->Feature |= ND_FEAT_MPX;
        }
        else if (0 == strcmp(argv[i], "-t cet"))
        {
            // Enable CET.
            if (Options->Feature == ND_FEAT_ALL)
            {
                Options->Feature = 0;
            }

            Options->Feature |= ND_FEAT_CET;
        }
        else if (0 == strcmp(argv[i], "-t cldm"))
        {
            // Enable Cache Line Demote.
            if (Options->Feature == ND_FEAT_ALL)
            {
                Options->Feature = 0;
            }

            Options->Feature |= ND_FEAT_CLDEMOTE;
        }
        else if (0 == strcmp(argv[i], "-t piti"))
        {
            // Enable Prefetch for instruction fetch.
            if (Options->Feature == ND_FEAT_ALL)
            {
                Options->Feature = 0;
            }

            Options->Feature |= ND_FEAT_PITI;
        }
        else if (0 == strcmp(argv[i], "-t none"))
        {
            // No feature support.
            Options->Feature = ND_FEAT_NONE;
        }
        else if (0 == strcmp(argv[i], "-nv"))
        {
            // Do not print anything.
            Options->Print = false;
        } 
        else if (0 == strcmp(argv[i], "-hl"))
        {
            // Highlight instruction components.
            Options->Highlight = true;
        }
        else if (0 == strcmp(argv[i], "-iv"))
        {
            // Print statistics.
            Options->Stats = true;
        }
        else if (0 == strcmp(argv[i], "-exi"))
        {
            // Print extended instruction information.
            Options->ExtendedInfo = true;
        }
        else if (0 == strcmp(argv[i], "-bits"))
        {
            // Print instruction bitfields.
            Options->BitFields = true;
        }
        else if (0 == strcmp(argv[i], "-skip16"))
        {
            // Skip 16 bytes after each decoded instruction.
            Options->Skip16 = true;
        }
        else if (0 == strcmp(argv[i], "-skip1"))
        {
            // Skip a single byte after each decoded instruction.
            Options->Skip1 = true;
        }
        else if (0 == strcmp(argv[i], "-skipdecoded"))
        {
            Options->SkipWriteDecoded = true;
        }
        else
        {
            printf("Unknown option: '%s'\n", argv[i]);
        }

        i++;
    }

    // Parse the input.
    if (!parse_input(Options))
    {
        printf("Could not find a valid input!\n");
        return false;
    }

    return true;
}